

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::GraphicsRobustAccessPass::WidenInteger
          (GraphicsRobustAccessPass *this,bool sign_extend,uint32_t bit_width,Instruction *value,
          Instruction *before_inst)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<spvtools::opt::Operand> __l;
  uint32_t type_id_00;
  undefined8 where_inst;
  uint32_t result_id;
  Op opcode;
  IRContext *pIVar1;
  TypeManager *this_00;
  tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  tVar2;
  Operand *local_118;
  allocator<spvtools::opt::Operand> local_10d;
  uint32_t local_10c;
  iterator local_108;
  undefined8 local_100;
  SmallVector<unsigned_int,_2UL> local_f8;
  Operand local_d0;
  iterator local_a0;
  _func_int **local_98;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_90;
  unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_78;
  Instruction *conversion;
  uint32_t conversion_id;
  uint32_t type_id;
  Type *unsigned_type;
  TypeManager *type_mgr;
  Integer unsigned_type_for_query;
  Instruction *before_inst_local;
  Instruction *value_local;
  uint32_t bit_width_local;
  bool sign_extend_local;
  GraphicsRobustAccessPass *this_local;
  
  unsigned_type_for_query._40_8_ = before_inst;
  analysis::Integer::Integer((Integer *)&type_mgr,bit_width,false);
  pIVar1 = Pass::context(&this->super_Pass);
  unsigned_type = (Type *)IRContext::get_type_mgr(pIVar1);
  _conversion_id =
       analysis::TypeManager::GetRegisteredType((TypeManager *)unsigned_type,(Type *)&type_mgr);
  pIVar1 = Pass::context(&this->super_Pass);
  this_00 = IRContext::get_type_mgr(pIVar1);
  conversion._4_4_ = analysis::TypeManager::GetId(this_00,_conversion_id);
  result_id = Pass::TakeNextId(&this->super_Pass);
  where_inst = unsigned_type_for_query._40_8_;
  type_id_00 = conversion._4_4_;
  opcode = OpUConvert;
  if (sign_extend) {
    opcode = OpSConvert;
  }
  conversion._0_4_ = result_id;
  local_10c = opt::Instruction::result_id(value);
  local_108 = &local_10c;
  local_100 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_108;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_f8,init_list);
  Operand::Operand(&local_d0,SPV_OPERAND_TYPE_ID,&local_f8);
  local_a0 = &local_d0;
  local_98 = (_func_int **)0x1;
  std::allocator<spvtools::opt::Operand>::allocator(&local_10d);
  __l._M_len = (size_type)local_98;
  __l._M_array = local_a0;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&local_90,__l,&local_10d);
  tVar2.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )InsertInst(this,(Instruction *)where_inst,opcode,type_id_00,result_id,&local_90);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_90);
  std::allocator<spvtools::opt::Operand>::~allocator(&local_10d);
  local_118 = (Operand *)&local_a0;
  do {
    local_118 = local_118 + -1;
    Operand::~Operand(local_118);
  } while (local_118 != &local_d0);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_f8);
  local_78._M_t.
  super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                  )(__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                    )tVar2.
                     super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     .
                     super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                     ._M_head_impl;
  analysis::Integer::~Integer((Integer *)&type_mgr);
  return (Instruction *)
         (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          )tVar2.
           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
           ._M_head_impl;
}

Assistant:

opt::Instruction* opt::GraphicsRobustAccessPass::WidenInteger(
    bool sign_extend, uint32_t bit_width, Instruction* value,
    Instruction* before_inst) {
  analysis::Integer unsigned_type_for_query(bit_width, false);
  auto* type_mgr = context()->get_type_mgr();
  auto* unsigned_type = type_mgr->GetRegisteredType(&unsigned_type_for_query);
  auto type_id = context()->get_type_mgr()->GetId(unsigned_type);
  auto conversion_id = TakeNextId();
  auto* conversion = InsertInst(
      before_inst, (sign_extend ? spv::Op::OpSConvert : spv::Op::OpUConvert),
      type_id, conversion_id, {{SPV_OPERAND_TYPE_ID, {value->result_id()}}});
  return conversion;
}